

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O2

void stk_InitFull(SolStack_t *stackPtr)

{
  int iVar1;
  time_t tVar2;
  ECardColor_t cc;
  ECardColor_t EVar3;
  ECardType_t ct;
  ECardType_t EVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  
  if (stackPtr != (SolStack_t *)0x0) {
    uVar9 = 0;
    memset(stackPtr,0,0x278);
    for (EVar3 = CC_SPADES; EVar3 != NUM_CARD_COLORS; EVar3 = EVar3 + CC_HEARTS) {
      uVar5 = uVar9;
      for (EVar4 = CT_ACE; EVar4 != NUM_CARD_TYPES; EVar4 = EVar4 + CT_ACE) {
        uVar6 = uVar5;
        if (uVar5 < 0x34) {
          uVar6 = uVar5 + 1;
          stackPtr->m_size = uVar6;
          stackPtr->m_cards[uVar5].m_color = EVar3;
          stackPtr->m_cards[uVar5].m_type = EVar4;
          stackPtr->m_cards[uVar5].m_face = CF_DOWN;
          uVar9 = uVar6;
        }
        uVar5 = uVar6;
      }
    }
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    sVar7 = stackPtr->m_size;
    while( true ) {
      uVar8 = (uint)(sVar7 - 1);
      if ((int)uVar8 < 0) break;
      iVar1 = rand();
      card_Swap(stackPtr->m_cards + (uVar8 & 0x7fffffff),stackPtr->m_cards + iVar1 % (int)sVar7);
      sVar7 = sVar7 - 1;
    }
  }
  return;
}

Assistant:

void stk_InitFull(SolStack_t* stackPtr)
{
  if (stackPtr) {
    stk_InitEmpty(stackPtr);
    // fill the stack with all combinations of color and type
    for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
      for (ECardType_t ct = CT_ACE; ct <= CT_KING; ct++) {
        PushNew(stackPtr, cc, ct);
      }
    }

    Shuffle(stackPtr);
  }
}